

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase319::run(TestCase319 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  uint16_t uVar2;
  Which WVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  ArrayPtr<const_char> AVar6;
  Reader RVar7;
  ArrayPtr<const_char> local_560;
  bool local_549;
  undefined1 auStack_548 [7];
  bool _kj_shouldLog_18;
  size_t local_540;
  ArrayPtr<const_char> local_538;
  bool local_521;
  undefined1 auStack_520 [7];
  bool _kj_shouldLog_17;
  size_t local_518;
  ArrayPtr<const_char> local_510;
  bool local_4f9;
  undefined1 auStack_4f8 [7];
  bool _kj_shouldLog_16;
  size_t local_4f0;
  uint16_t local_4e2;
  uint local_4e0;
  bool local_4d9;
  uint64_t uStack_4d8;
  bool _kj_shouldLog_15;
  unsigned_long_long local_4d0;
  bool local_4c1;
  undefined1 local_4c0 [7];
  bool _kj_shouldLog_14;
  Reader corge_3;
  unsigned_long_long local_488;
  bool local_47d;
  uint32_t local_47c;
  uint uStack_478;
  bool _kj_shouldLog_13;
  bool local_471;
  undefined1 local_470 [7];
  bool _kj_shouldLog_12;
  undefined1 local_440 [8];
  Reader group_4;
  bool _kj_shouldLog_11;
  Which local_406 [2];
  bool local_401;
  bool _kj_shouldLog_10;
  uint64_t uStack_400;
  bool _kj_shouldLog_9;
  uint local_3f4;
  bool local_3ed;
  uint32_t local_3ec;
  uint uStack_3e8;
  bool _kj_shouldLog_8;
  bool local_3e1;
  undefined1 local_3e0 [7];
  bool _kj_shouldLog_7;
  undefined1 local_3b8 [8];
  Reader group_3;
  bool local_371;
  undefined1 auStack_370 [7];
  bool _kj_shouldLog_6;
  size_t local_368;
  ArrayPtr<const_char> local_360;
  bool local_349;
  undefined1 auStack_348 [7];
  bool _kj_shouldLog_5;
  size_t local_340;
  ArrayPtr<const_char> local_338;
  bool local_321;
  undefined1 auStack_320 [7];
  bool _kj_shouldLog_4;
  size_t local_318;
  uint16_t local_30a;
  uint local_308;
  bool local_301;
  uint64_t uStack_300;
  bool _kj_shouldLog_3;
  unsigned_long_long local_2f8;
  bool local_2e9;
  undefined1 local_2e8 [7];
  bool _kj_shouldLog_2;
  Reader corge_2;
  unsigned_long_long local_2b0;
  bool local_2a5;
  uint32_t local_2a4;
  uint uStack_2a0;
  bool _kj_shouldLog_1;
  bool local_299;
  undefined1 local_298 [7];
  bool _kj_shouldLog;
  undefined1 local_268 [8];
  Reader group_2;
  ArrayPtr<const_char> local_228;
  ArrayPtr<const_char> local_218;
  undefined1 local_208 [8];
  Builder corge_1;
  Builder group_1;
  ArrayPtr<const_char> local_1a8;
  ArrayPtr<const_char> local_198;
  undefined1 local_188 [8];
  Builder corge;
  Builder group;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase319 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestInterleavedGroups>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestInterleavedGroups::Builder::getGroup1
            ((Builder *)&corge._builder.dataSize,(Builder *)local_128);
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Builder::setFoo
            ((Builder *)&corge._builder.dataSize,0xbc614e);
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Builder::setBar
            ((Builder *)&corge._builder.dataSize,0x7048860ddf79);
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Builder::initCorge
            ((Builder *)local_188,(Builder *)&corge._builder.dataSize);
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Builder::setGrault
            ((Builder *)local_188,0x3824430f8500d);
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Builder::setGarply
            ((Builder *)local_188,0x3039);
  Text::Reader::Reader((Reader *)&local_198,"plugh");
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Builder::setPlugh
            ((Builder *)local_188,(Reader)local_198);
  Text::Reader::Reader((Reader *)&local_1a8,"xyzzy");
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Builder::setXyzzy
            ((Builder *)local_188,(Reader)local_1a8);
  Text::Reader::Reader((Reader *)&group_1._builder.dataSize,"waldo");
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Builder::setWaldo
            ((Builder *)&corge._builder.dataSize,(Reader)stack0xfffffffffffffe48);
  capnproto_test::capnp::test::TestInterleavedGroups::Builder::getGroup2
            ((Builder *)&corge_1._builder.dataSize,(Builder *)local_128);
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Builder::setFoo
            ((Builder *)&corge_1._builder.dataSize,0x165ec15);
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Builder::setBar
            ((Builder *)&corge_1._builder.dataSize,0xd55697c43ac0);
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Builder::initCorge
            ((Builder *)local_208,(Builder *)&corge_1._builder.dataSize);
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Builder::setGrault
            ((Builder *)local_208,0x31d361eb8a086);
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Builder::setGarply
            ((Builder *)local_208,0x5ba0);
  Text::Reader::Reader((Reader *)&local_218,"hgulp");
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Builder::setPlugh
            ((Builder *)local_208,(Reader)local_218);
  Text::Reader::Reader((Reader *)&local_228,"yzzyx");
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Builder::setXyzzy
            ((Builder *)local_208,(Reader)local_228);
  Text::Reader::Reader((Reader *)&group_2._reader.nestingLimit,"odlaw");
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Builder::setWaldo
            ((Builder *)&corge_1._builder.dataSize,(Reader)stack0xfffffffffffffdc8);
  capnproto_test::capnp::test::TestInterleavedGroups::Builder::asReader
            ((Reader *)local_298,(Builder *)local_128);
  capnproto_test::capnp::test::TestInterleavedGroups::Reader::getGroup1
            ((Reader *)local_268,(Reader *)local_298);
  uVar4 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getFoo
                    ((Reader *)local_268);
  if (uVar4 != 0xbc614e) {
    local_299 = kj::_::Debug::shouldLog(ERROR);
    while (local_299 != false) {
      uStack_2a0 = 0xbc614e;
      local_2a4 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getFoo
                            ((Reader *)local_268);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(12345678u) == (group.getFoo())\", 12345678u, group.getFoo()"
                 ,(char (*) [49])"failed: expected (12345678u) == (group.getFoo())",
                 &stack0xfffffffffffffd60,&local_2a4);
      local_299 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getBar
                    ((Reader *)local_268);
  if (uVar5 != 0x7048860ddf79) {
    local_2a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a5 != false) {
      local_2b0 = 0x7048860ddf79;
      corge_2._reader._40_8_ =
           capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getBar
                     ((Reader *)local_268);
      kj::_::Debug::log<char_const(&)[58],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x160,ERROR,
                 "\"failed: expected \" \"(123456789012345llu) == (group.getBar())\", 123456789012345llu, group.getBar()"
                 ,(char (*) [58])"failed: expected (123456789012345llu) == (group.getBar())",
                 &local_2b0,(unsigned_long *)&corge_2._reader.nestingLimit);
      local_2a5 = false;
    }
  }
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getCorge
            ((Reader *)local_2e8,(Reader *)local_268);
  uVar5 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getGrault
                    ((Reader *)local_2e8);
  if (uVar5 != 0x3824430f8500d) {
    local_2e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e9 != false) {
      local_2f8 = 0x3824430f8500d;
      uStack_300 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::
                   getGrault((Reader *)local_2e8);
      kj::_::Debug::log<char_const(&)[61],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x162,ERROR,
                 "\"failed: expected \" \"(987654321098765llu) == (corge.getGrault())\", 987654321098765llu, corge.getGrault()"
                 ,(char (*) [61])"failed: expected (987654321098765llu) == (corge.getGrault())",
                 &local_2f8,&stack0xfffffffffffffd00);
      local_2e9 = false;
    }
  }
  uVar2 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getGarply
                    ((Reader *)local_2e8);
  if (uVar2 != 0x3039) {
    local_301 = kj::_::Debug::shouldLog(ERROR);
    while (local_301 != false) {
      local_308 = 0x3039;
      local_30a = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::
                  getGarply((Reader *)local_2e8);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x163,ERROR,
                 "\"failed: expected \" \"(12345u) == (corge.getGarply())\", 12345u, corge.getGarply()"
                 ,(char (*) [49])"failed: expected (12345u) == (corge.getGarply())",&local_308,
                 &local_30a);
      local_301 = false;
    }
  }
  _auStack_320 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getPlugh
                           ((Reader *)local_2e8);
  bVar1 = kj::operator==("plugh",(StringPtr *)auStack_320);
  if (!bVar1) {
    local_321 = kj::_::Debug::shouldLog(ERROR);
    while (local_321 != false) {
      AVar6 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getPlugh
                        ((Reader *)local_2e8);
      local_338 = AVar6;
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(\\\"plugh\\\") == (corge.getPlugh())\", \"plugh\", corge.getPlugh()"
                 ,(char (*) [49])"failed: expected (\"plugh\") == (corge.getPlugh())",
                 (char (*) [6])"plugh",(Reader *)&local_338);
      local_321 = false;
    }
  }
  _auStack_348 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getXyzzy
                           ((Reader *)local_2e8);
  bVar1 = kj::operator==("xyzzy",(StringPtr *)auStack_348);
  if (!bVar1) {
    local_349 = kj::_::Debug::shouldLog(ERROR);
    while (local_349 != false) {
      AVar6 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getXyzzy
                        ((Reader *)local_2e8);
      local_360 = AVar6;
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x165,ERROR,
                 "\"failed: expected \" \"(\\\"xyzzy\\\") == (corge.getXyzzy())\", \"xyzzy\", corge.getXyzzy()"
                 ,(char (*) [49])"failed: expected (\"xyzzy\") == (corge.getXyzzy())",
                 (char (*) [6])"xyzzy",(Reader *)&local_360);
      local_349 = false;
    }
  }
  _auStack_370 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getWaldo
                           ((Reader *)local_268);
  bVar1 = kj::operator==("waldo",(StringPtr *)auStack_370);
  if (!bVar1) {
    local_371 = kj::_::Debug::shouldLog(ERROR);
    while (local_371 != false) {
      RVar7 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getWaldo
                        ((Reader *)local_268);
      group_3._reader._40_8_ = RVar7.super_StringPtr.content.ptr;
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x166,ERROR,
                 "\"failed: expected \" \"(\\\"waldo\\\") == (group.getWaldo())\", \"waldo\", group.getWaldo()"
                 ,(char (*) [49])"failed: expected (\"waldo\") == (group.getWaldo())",
                 (char (*) [6])"waldo",(Reader *)&group_3._reader.nestingLimit);
      local_371 = false;
    }
  }
  capnproto_test::capnp::test::TestInterleavedGroups::Builder::initGroup1
            ((Builder *)local_3e0,(Builder *)local_128);
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Builder::asReader
            ((Reader *)local_3b8,(Builder *)local_3e0);
  uVar4 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getFoo
                    ((Reader *)local_3b8);
  if (uVar4 != 0) {
    local_3e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3e1 != false) {
      uStack_3e8 = 0;
      local_3ec = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getFoo
                            ((Reader *)local_3b8);
      kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"(0u) == (group.getFoo())\", 0u, group.getFoo()",
                 (char (*) [42])"failed: expected (0u) == (group.getFoo())",&stack0xfffffffffffffc18
                 ,&local_3ec);
      local_3e1 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getBar
                    ((Reader *)local_3b8);
  if (uVar5 != 0) {
    local_3ed = kj::_::Debug::shouldLog(ERROR);
    while (local_3ed != false) {
      local_3f4 = 0;
      uStack_400 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getBar
                             ((Reader *)local_3b8);
      kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x16d,ERROR,
                 "\"failed: expected \" \"(0u) == (group.getBar())\", 0u, group.getBar()",
                 (char (*) [42])"failed: expected (0u) == (group.getBar())",&local_3f4,
                 &stack0xfffffffffffffc00);
      local_3ed = false;
    }
  }
  WVar3 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::which
                    ((Reader *)local_3b8);
  if (WVar3 != QUX) {
    local_401 = kj::_::Debug::shouldLog(ERROR);
    while (local_401 != false) {
      local_406[1] = 0;
      local_406[0] = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::which
                               ((Reader *)local_3b8);
      kj::_::Debug::
      log<char_const(&)[79],capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which,capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x16e,ERROR,
                 "\"failed: expected \" \"(test::TestInterleavedGroups::Group1::QUX) == (group.which())\", test::TestInterleavedGroups::Group1::QUX, group.which()"
                 ,(char (*) [79])
                  "failed: expected (test::TestInterleavedGroups::Group1::QUX) == (group.which())",
                 local_406 + 1,local_406);
      local_401 = false;
    }
  }
  uVar2 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getQux
                    ((Reader *)local_3b8);
  if (uVar2 != 0) {
    _kj_shouldLog_11 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_11 != false) {
      group_4._reader._44_4_ = 0;
      group_4._reader.nestingLimit._2_2_ =
           capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getQux
                     ((Reader *)local_3b8);
      kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x16f,ERROR,
                 "\"failed: expected \" \"(0u) == (group.getQux())\", 0u, group.getQux()",
                 (char (*) [42])"failed: expected (0u) == (group.getQux())",
                 (uint *)&group_4._reader.field_0x2c,
                 (unsigned_short *)((long)&group_4._reader.nestingLimit + 2));
      _kj_shouldLog_11 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::hasWaldo
                    ((Reader *)local_3b8);
  if (bVar1) {
    group_4._reader.nestingLimit._1_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)group_4._reader.nestingLimit._1_1_ != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x170,ERROR,"\"failed: expected \" \"!(group.hasWaldo())\"",
                 (char (*) [37])"failed: expected !(group.hasWaldo())");
      group_4._reader.nestingLimit._1_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestInterleavedGroups::Builder::asReader
            ((Reader *)local_470,(Builder *)local_128);
  capnproto_test::capnp::test::TestInterleavedGroups::Reader::getGroup2
            ((Reader *)local_440,(Reader *)local_470);
  uVar4 = capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getFoo
                    ((Reader *)local_440);
  if (uVar4 != 0x165ec15) {
    local_471 = kj::_::Debug::shouldLog(ERROR);
    while (local_471 != false) {
      uStack_478 = 0x165ec15;
      local_47c = capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getFoo
                            ((Reader *)local_440);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x176,ERROR,
                 "\"failed: expected \" \"(23456789u) == (group.getFoo())\", 23456789u, group.getFoo()"
                 ,(char (*) [49])"failed: expected (23456789u) == (group.getFoo())",
                 &stack0xfffffffffffffb88,&local_47c);
      local_471 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getBar
                    ((Reader *)local_440);
  if (uVar5 != 0xd55697c43ac0) {
    local_47d = kj::_::Debug::shouldLog(ERROR);
    while (local_47d != false) {
      local_488 = 0xd55697c43ac0;
      corge_3._reader._40_8_ =
           capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getBar
                     ((Reader *)local_440);
      kj::_::Debug::log<char_const(&)[58],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x177,ERROR,
                 "\"failed: expected \" \"(234567890123456llu) == (group.getBar())\", 234567890123456llu, group.getBar()"
                 ,(char (*) [58])"failed: expected (234567890123456llu) == (group.getBar())",
                 &local_488,(unsigned_long *)&corge_3._reader.nestingLimit);
      local_47d = false;
    }
  }
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getCorge
            ((Reader *)local_4c0,(Reader *)local_440);
  uVar5 = capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getGrault
                    ((Reader *)local_4c0);
  if (uVar5 != 0x31d361eb8a086) {
    local_4c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4c1 != false) {
      local_4d0 = 0x31d361eb8a086;
      uStack_4d8 = capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::
                   getGrault((Reader *)local_4c0);
      kj::_::Debug::log<char_const(&)[61],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x179,ERROR,
                 "\"failed: expected \" \"(876543210987654llu) == (corge.getGrault())\", 876543210987654llu, corge.getGrault()"
                 ,(char (*) [61])"failed: expected (876543210987654llu) == (corge.getGrault())",
                 &local_4d0,&stack0xfffffffffffffb28);
      local_4c1 = false;
    }
  }
  uVar2 = capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getGarply
                    ((Reader *)local_4c0);
  if (uVar2 != 0x5ba0) {
    local_4d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4d9 != false) {
      local_4e0 = 0x5ba0;
      local_4e2 = capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::
                  getGarply((Reader *)local_4c0);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x17a,ERROR,
                 "\"failed: expected \" \"(23456u) == (corge.getGarply())\", 23456u, corge.getGarply()"
                 ,(char (*) [49])"failed: expected (23456u) == (corge.getGarply())",&local_4e0,
                 &local_4e2);
      local_4d9 = false;
    }
  }
  _auStack_4f8 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getPlugh
                           ((Reader *)local_4c0);
  bVar1 = kj::operator==("hgulp",(StringPtr *)auStack_4f8);
  if (!bVar1) {
    local_4f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4f9 != false) {
      AVar6 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getPlugh
                        ((Reader *)local_4c0);
      local_510 = AVar6;
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x17b,ERROR,
                 "\"failed: expected \" \"(\\\"hgulp\\\") == (corge.getPlugh())\", \"hgulp\", corge.getPlugh()"
                 ,(char (*) [49])"failed: expected (\"hgulp\") == (corge.getPlugh())",
                 (char (*) [6])"hgulp",(Reader *)&local_510);
      local_4f9 = false;
    }
  }
  _auStack_520 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getXyzzy
                           ((Reader *)local_4c0);
  bVar1 = kj::operator==("yzzyx",(StringPtr *)auStack_520);
  if (!bVar1) {
    local_521 = kj::_::Debug::shouldLog(ERROR);
    while (local_521 != false) {
      AVar6 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getXyzzy
                        ((Reader *)local_4c0);
      local_538 = AVar6;
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x17c,ERROR,
                 "\"failed: expected \" \"(\\\"yzzyx\\\") == (corge.getXyzzy())\", \"yzzyx\", corge.getXyzzy()"
                 ,(char (*) [49])"failed: expected (\"yzzyx\") == (corge.getXyzzy())",
                 (char (*) [6])"yzzyx",(Reader *)&local_538);
      local_521 = false;
    }
  }
  _auStack_548 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getWaldo
                           ((Reader *)local_440);
  bVar1 = kj::operator==("odlaw",(StringPtr *)auStack_548);
  if (!bVar1) {
    local_549 = kj::_::Debug::shouldLog(ERROR);
    while (local_549 != false) {
      AVar6 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getWaldo
                        ((Reader *)local_440);
      local_560 = AVar6;
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x17d,ERROR,
                 "\"failed: expected \" \"(\\\"odlaw\\\") == (group.getWaldo())\", \"odlaw\", group.getWaldo()"
                 ,(char (*) [49])"failed: expected (\"odlaw\") == (group.getWaldo())",
                 (char (*) [6])"odlaw",(Reader *)&local_560);
      local_549 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, InterleavedGroups) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestInterleavedGroups>();

  // Init both groups to different values.
  {
    auto group = root.getGroup1();
    group.setFoo(12345678u);
    group.setBar(123456789012345llu);
    auto corge = group.initCorge();
    corge.setGrault(987654321098765llu);
    corge.setGarply(12345u);
    corge.setPlugh("plugh");
    corge.setXyzzy("xyzzy");
    group.setWaldo("waldo");
  }

  {
    auto group = root.getGroup2();
    group.setFoo(23456789u);
    group.setBar(234567890123456llu);
    auto corge = group.initCorge();
    corge.setGrault(876543210987654llu);
    corge.setGarply(23456u);
    corge.setPlugh("hgulp");
    corge.setXyzzy("yzzyx");
    group.setWaldo("odlaw");
  }

  // Check group1 is still set correctly.
  {
    auto group = root.asReader().getGroup1();
    EXPECT_EQ(12345678u, group.getFoo());
    EXPECT_EQ(123456789012345llu, group.getBar());
    auto corge = group.getCorge();
    EXPECT_EQ(987654321098765llu, corge.getGrault());
    EXPECT_EQ(12345u, corge.getGarply());
    EXPECT_EQ("plugh", corge.getPlugh());
    EXPECT_EQ("xyzzy", corge.getXyzzy());
    EXPECT_EQ("waldo", group.getWaldo());
  }

  // Zero out group 1 and see if it is zero'd.
  {
    auto group = root.initGroup1().asReader();
    EXPECT_EQ(0u, group.getFoo());
    EXPECT_EQ(0u, group.getBar());
    EXPECT_EQ(test::TestInterleavedGroups::Group1::QUX, group.which());
    EXPECT_EQ(0u, group.getQux());
    EXPECT_FALSE(group.hasWaldo());
  }

  // Group 2 should not have been touched.
  {
    auto group = root.asReader().getGroup2();
    EXPECT_EQ(23456789u, group.getFoo());
    EXPECT_EQ(234567890123456llu, group.getBar());
    auto corge = group.getCorge();
    EXPECT_EQ(876543210987654llu, corge.getGrault());
    EXPECT_EQ(23456u, corge.getGarply());
    EXPECT_EQ("hgulp", corge.getPlugh());
    EXPECT_EQ("yzzyx", corge.getXyzzy());
    EXPECT_EQ("odlaw", group.getWaldo());
  }
}